

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-time.c
# Opt level: O0

int run_test_loop_update_time(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uint64_t start;
  
  puVar2 = uv_default_loop();
  uVar3 = uv_now(puVar2);
  do {
    puVar2 = uv_default_loop();
    uVar4 = uv_now(puVar2);
    if (999 < uVar4 - uVar3) {
      puVar2 = uv_default_loop();
      close_loop(puVar2);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if ((long)iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-time.c"
              ,0x21,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
      abort();
    }
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_NOWAIT);
  } while ((long)iVar1 == 0);
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-time.c"
          ,0x1f,"uv_run(uv_default_loop(), UV_RUN_NOWAIT)","==","0",(long)iVar1,"==",0);
  abort();
}

Assistant:

TEST_IMPL(loop_update_time) {
  uint64_t start;

  start = uv_now(uv_default_loop());
  while (uv_now(uv_default_loop()) - start < 1000)
    ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}